

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall Fossilize::ConcurrentDatabase::prepare(ConcurrentDatabase *this)

{
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *puVar1;
  uint uVar2;
  Impl *pIVar3;
  pointer ppEVar4;
  DatabaseInterface *pDVar5;
  __uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  this_00;
  pointer puVar6;
  StreamArchive *this_01;
  uint *puVar7;
  bool bVar8;
  int iVar9;
  size_type sVar10;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *puVar11;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  pointer puVar12;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range4;
  ulong uVar13;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra_1;
  uint *puVar14;
  
  if (OverWrite < this->mode) {
    return false;
  }
  if (this->mode == ReadOnly) {
    sVar10 = (this->bucket_dirname)._M_string_length;
    if ((sVar10 != 0) && ((this->bucket_basename)._M_string_length != 0)) {
      return false;
    }
  }
  else {
    pIVar3 = (this->super_DatabaseInterface).impl;
    if ((pIVar3->sub_databases_in_whitelist).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pIVar3->sub_databases_in_whitelist).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return false;
    }
    sVar10 = (this->bucket_dirname)._M_string_length;
  }
  if ((sVar10 != 0) && (bVar8 = setup_bucket(this), !bVar8)) {
    return false;
  }
  pIVar3 = (this->super_DatabaseInterface).impl;
  ppEVar4 = (pIVar3->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar4 !=
      (pIVar3->imported_metadata).
      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pDVar5 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar5 != (DatabaseInterface *)0x0) {
      DatabaseInterface::add_imported_metadata(pDVar5,*ppEVar4);
    }
    for (uVar13 = 1; pIVar3 = (this->super_DatabaseInterface).impl,
        ppEVar4 = (pIVar3->imported_metadata).
                  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar13 < (ulong)((long)(pIVar3->imported_metadata).
                               super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >> 3);
        uVar13 = uVar13 + 1) {
      puVar12 = (this->extra_readonly).
                super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar13 - 1 <
           (ulong)((long)(this->extra_readonly).
                         super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3)) &&
         (this_00._M_t.
          super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
          .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
               puVar12[uVar13 - 1]._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t,
         (_Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
          )this_00._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl !=
         (DatabaseInterface *)0x0)) {
        DatabaseInterface::add_imported_metadata
                  ((DatabaseInterface *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl,
                   ppEVar4[uVar13]);
      }
    }
  }
  if (this->has_prepared_readonly == false) {
    puVar1 = &this->readonly_interface;
    pDVar5 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar5 != (DatabaseInterface *)0x0) &&
       (iVar9 = (*pDVar5->_vptr_DatabaseInterface[2])(), (char)iVar9 == '\0')) {
      pDVar5 = (puVar1->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (puVar1->_M_t).
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           (DatabaseInterface *)0x0;
      if (pDVar5 != (DatabaseInterface *)0x0) {
        (*pDVar5->_vptr_DatabaseInterface[1])();
      }
    }
    puVar6 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->extra_readonly).
                   super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar6;
        puVar12 = puVar12 + 1) {
      this_01 = (StreamArchive *)
                (puVar12->_M_t).
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (this_01 != (StreamArchive *)0x0) {
        StreamArchive::resolve_path(this_01,&this->base_path);
        iVar9 = (*((puVar12->_M_t).
                   super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl)->
                  _vptr_DatabaseInterface[2])();
        if ((char)iVar9 == '\0') {
          pDVar5 = (puVar12->_M_t).
                   super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
          (puVar12->_M_t).
          super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ._M_t.
          super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
          .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
               (DatabaseInterface *)0x0;
          if (pDVar5 != (DatabaseInterface *)0x0) {
            (*pDVar5->_vptr_DatabaseInterface[1])();
          }
        }
      }
    }
    pIVar3 = (this->super_DatabaseInterface).impl;
    puVar7 = (pIVar3->sub_databases_in_whitelist).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar14 = (pIVar3->sub_databases_in_whitelist).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar14 != puVar7; puVar14 = puVar14 + 1) {
      uVar2 = *puVar14;
      puVar11 = puVar1;
      if ((ulong)uVar2 == 0) {
LAB_00142394:
        pDVar5 = (puVar11->_M_t).
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        if ((pDVar5 != (DatabaseInterface *)0x0) &&
           (bVar8 = DatabaseInterface::add_to_implicit_whitelist
                              (&this->super_DatabaseInterface,pDVar5), !bVar8)) {
          return false;
        }
      }
      else {
        puVar12 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar2 <=
            (ulong)((long)(this->extra_readonly).
                          super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3)) {
          puVar11 = puVar12 + (uVar2 - 1);
          goto LAB_00142394;
        }
      }
    }
    if (((this->super_DatabaseInterface).impl)->imported_concurrent_metadata ==
        (ExportedMetadataHeader *)0x0) {
      pDVar5 = (puVar1->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar5 != (DatabaseInterface *)0x0) {
        prime_read_only_hashes(this,pDVar5);
      }
      puVar6 = (this->extra_readonly).
               super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (this->extra_readonly).
                     super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar6;
          puVar12 = puVar12 + 1) {
        pDVar5 = (puVar12->_M_t).
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        if (pDVar5 != (DatabaseInterface *)0x0) {
          prime_read_only_hashes(this,pDVar5);
        }
      }
    }
    if (this->mode == Append) {
      pDVar5 = (puVar1->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (puVar1->_M_t).
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           (DatabaseInterface *)0x0;
      if (pDVar5 != (DatabaseInterface *)0x0) {
        (*pDVar5->_vptr_DatabaseInterface[1])();
      }
      std::
      vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
      ::clear(&this->extra_readonly);
    }
  }
  this->has_prepared_readonly = true;
  return true;
}

Assistant:

bool prepare() override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::ReadOnly &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (mode != DatabaseMode::ReadOnly && !impl->sub_databases_in_whitelist.empty())
			return false;

		if (mode == DatabaseMode::ReadOnly && !bucket_dirname.empty() && !bucket_basename.empty())
			return false;

		if (!bucket_dirname.empty() && !setup_bucket())
			return false;

		// Set inherited metadata in sub-databases before we prepare them.
		if (!impl->imported_metadata.empty())
		{
			if (readonly_interface)
				readonly_interface->add_imported_metadata(impl->imported_metadata.front());

			for (size_t i = 1; i < impl->imported_metadata.size(); i++)
			{
				size_t extra_index = i - 1;
				if (extra_index < extra_readonly.size() && extra_readonly[extra_index])
					extra_readonly[extra_index]->add_imported_metadata(impl->imported_metadata[i]);
			}
		}

		if (!has_prepared_readonly)
		{
			// Prepare everything.
			// It's okay if the database doesn't exist.
			if (readonly_interface && !readonly_interface->prepare())
				readonly_interface.reset();

			for (auto &extra : extra_readonly)
			{
				if (extra)
				{
					static_cast<StreamArchive &>(*extra).resolve_path(base_path);
					if (!extra->prepare())
						extra.reset();
				}
			}

			// Promote databases to whitelist.
			for (unsigned index : impl->sub_databases_in_whitelist)
			{
				DatabaseInterface *iface = nullptr;
				if (index == 0)
					iface = readonly_interface.get();
				else if (index <= extra_readonly.size())
					iface = extra_readonly[index - 1].get();

				// It's okay if the archive does not exist, we just ignore it.
				if (iface && !add_to_implicit_whitelist(*iface))
					return false;
			}

			// Prime the hashmaps, however, we'll rely on concurrent metadata if we have it to avoid memory bloat.
			if (!impl->imported_concurrent_metadata)
			{
				if (readonly_interface)
					prime_read_only_hashes(*readonly_interface);

				for (auto &extra : extra_readonly)
					if (extra)
						prime_read_only_hashes(*extra);
			}

			// We only need the database for priming purposes.
			if (mode == DatabaseMode::Append)
			{
				readonly_interface.reset();
				extra_readonly.clear();
			}
		}

		has_prepared_readonly = true;
		return true;
	}